

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::IsReadyCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  int iVar2;
  Output OStack_18;
  char *params_local;
  
  params_local = params;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&params_local);
  if (bVar1) {
    Output::Output(&OStack_18,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"usage: ");
    std::operator<<((ostream *)&std::cout,(string *)token::IsReady_abi_cxx11_);
    Output::~Output(&OStack_18);
    Output::Output(&OStack_18,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Output readyok when engine is ready to receive input.");
  }
  else {
    iVar2 = (*this->engine->_vptr_ChessEngine[8])();
    if ((char)iVar2 == '\0') {
      (*this->engine->_vptr_ChessEngine[7])();
    }
    Output::Output(&OStack_18,NoPrefix);
    std::operator<<((ostream *)&std::cout,"readyok");
  }
  Output::~Output(&OStack_18);
  return;
}

Assistant:

void UCIAdapter::IsReadyCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::IsReady;
    Output() << "Output readyok when engine is ready to receive input.";
    return;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
  }
  Output(Output::NoPrefix) << "readyok";
}